

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::HeapType::HeapType(HeapType *this,Signature sig)

{
  undefined8 uVar1;
  HeapType HVar2;
  Type info;
  undefined8 local_28;
  
  info.id = sig.params.id.id;
  local_28 = operator_new(0x50);
  ((HeapTypeInfo *)local_28)->isTemp = false;
  ((HeapTypeInfo *)local_28)->isOpen = false;
  ((HeapTypeInfo *)local_28)->share = Unshared;
  ((HeapTypeInfo *)local_28)->supertype = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_28)->descriptor = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_28)->described = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_28)->recGroup = (RecGroupInfo_conflict *)0x0;
  ((HeapTypeInfo *)local_28)->recGroupIndex = 0;
  ((HeapTypeInfo *)local_28)->kind = Func;
  (((HeapTypeInfo *)local_28)->field_9).struct_.fields.
  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)sig.params.id.id;
  (((HeapTypeInfo *)local_28)->field_9).signature.results.id = sig.results.id.id;
  HVar2 = anon_unknown_0::RecGroupStore::insert((RecGroupStore *)&stack0xffffffffffffffd8,info.id);
  uVar1 = local_28;
  this->id = (uintptr_t)HVar2;
  if ((HeapTypeInfo *)local_28 != (HeapTypeInfo *)0x0) {
    anon_unknown_0::HeapTypeInfo::~HeapTypeInfo((HeapTypeInfo *)local_28);
    operator_delete((void *)uVar1,0x50);
    return;
  }
  return;
}

Assistant:

HeapType::HeapType(Signature sig) {
  new (this)
    HeapType(globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(sig)));
}